

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

void __thiscall
AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand
          (MoveMemFromConstCommand *this,CTemp *target,int constant)

{
  pointer pcVar1;
  
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00184f58;
  (this->target).name._M_dataplus._M_p = (pointer)&(this->target).name.field_2;
  pcVar1 = (target->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target,pcVar1,pcVar1 + (target->name)._M_string_length);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand( const IRT::CTemp &target, int constant ) : target(
        target ), constant( constant ) { }